

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O2

void project_monster_handler_NEXUS(project_monster_handler_context_t *context)

{
  wchar_t wVar1;
  uint32_t uVar2;
  
  project_monster_resist_other(context,L'X',L'\x03',true,MON_MSG_RESIST);
  uVar2 = Rand_div(3);
  if (uVar2 == 0) {
    wVar1 = L'\n';
  }
  else {
    uVar2 = Rand_div(4);
    if (uVar2 != 0) {
      return;
    }
    wVar1 = L'2';
  }
  context->teleport_distance = wVar1;
  return;
}

Assistant:

static void project_monster_handler_NEXUS(project_monster_handler_context_t *context)
{
	project_monster_resist_other(context, RF_IM_NEXUS, 3, true, MON_MSG_RESIST);

	if (one_in_(3)) {
		/* Blink */
		context->teleport_distance = 10;
	} else if (one_in_(4)) {
		/* Teleport */
		context->teleport_distance = 50;
	}
}